

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_custom_callback(void)

{
  int iVar1;
  char *local_48;
  char *args [3];
  _test_data_t data;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  iVar1 = cargo_init((cargo_t *)&data,0,"program");
  if (iVar1 == 0) {
    local_48 = "program";
    args[0] = "--alpha";
    args[1] = "128x64";
    cargo_set_flags((cargo_t)data,CARGO_AUTOCLEAN);
    iVar1 = cargo_add_option((cargo_t)data,0,"--alpha","The alpha","c",_test_cb,args + 2);
    if (iVar1 == 0) {
      cargo_parse((cargo_t)data,0,1,3,&local_48);
      printf("%dx%d\n",(ulong)(uint)args[2],(ulong)args[2]._4_4_);
      if ((uint)args[2] == 0x80) {
        if (args[2]._4_4_ != 0x40) {
          pcStack_18 = "Height expected to be 128";
        }
      }
      else {
        pcStack_18 = "Width expected to be 128";
      }
    }
    else {
      pcStack_18 = "Failed to add options";
    }
    cargo_destroy((cargo_t *)&data);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_custom_callback)
{
    _test_data_t data;
    char *args[] = { "program", "--alpha", "128x64" };

    cargo_set_flags(cargo, CARGO_AUTOCLEAN);

    ret |= cargo_add_option(cargo, 0, "--alpha", "The alpha", "c", _test_cb, &data);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    printf("%dx%d\n", data.width, data.height);
    cargo_assert(data.width == 128, "Width expected to be 128");
    cargo_assert(data.height == 64, "Height expected to be 128");

    _TEST_CLEANUP();
}